

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix_lc.c
# Opt level: O0

double ** one_two(double *input,int row,int col)

{
  double **ppdVar1;
  int local_28;
  int local_24;
  int j;
  int i;
  double **output;
  int col_local;
  int row_local;
  double *input_local;
  
  ppdVar1 = Make2DArray(row,col);
  for (local_24 = 0; local_24 < row; local_24 = local_24 + 1) {
    for (local_28 = 0; local_28 < col; local_28 = local_28 + 1) {
      ppdVar1[local_24][local_28] = input[local_24 * row + local_28];
    }
  }
  return ppdVar1;
}

Assistant:

double** one_two(double* input,int row,int col){
    double** output = Make2DArray(row,col);
    for(int i = 0;i < row;i++)
        for(int j = 0;j < col;j++)
            output[i][j] = input[i * row + j];
    return output;
}